

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

string * StringFormatVa_abi_cxx11_(string *__return_storage_ptr__,PCSTR format,__va_list_tag *va)

{
  size_t __n;
  reference pvVar1;
  size_type __maxlen;
  allocator<char> local_65 [20];
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> s;
  va_list va2;
  __va_list_tag *va_local;
  PCSTR format_local;
  
  s.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = va->gp_offset;
  s.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = va->fp_offset;
  __n = string_vformat_length(format,va);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,__n,&local_51);
  std::allocator<char>::~allocator(&local_51);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,0);
  __maxlen = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)local_50);
  vsnprintf(pvVar1,__maxlen,format,
            &s.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar1,local_65);
  std::allocator<char>::~allocator(local_65);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string StringFormatVa (PCSTR format, va_list va)
{
    // Some systems, including Linux/amd64, cannot consume a
    // va_list multiple times. It must be copied first.
    // Passing the parameter twice does not work.
#ifndef _WIN32
    va_list va2;
#ifdef __va_copy
    __va_copy (va2, va);
#else
    va_copy (va2, va); // C99
#endif
#endif

    std::vector <char> s (string_vformat_length (format, va));

#ifdef _WIN32
    _vsnprintf (&s [0], s.size (), format, va);
#else
    vsnprintf (&s [0], s.size (), format, va2);
#endif
    return &s [0];
}